

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# non_recursive_quick_sort.c
# Opt level: O0

int main(void)

{
  int local_3c;
  uint local_38;
  int i;
  int arr [10];
  int n;
  
  arr[9] = 0;
  arr[8] = 10;
  memcpy(&local_38,&DAT_00102010,0x28);
  quick_sort((int *)&local_38,10);
  for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
    printf("%d ",(ulong)(&local_38)[local_3c]);
  }
  return 0;
}

Assistant:

int main() {
  const int n = 10;
  int arr[n] = {35, 17, 33, 89, 31, 163, 72, 90, 26, 21};
  quick_sort(arr, n);
  for (int i = 0; i < n; i++) {
    printf("%d ", arr[i]);
  }

  return 0;
}